

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O2

void lws_addrinfo_clean(lws *wsi)

{
  if ((addrinfo *)wsi->dns_results != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)wsi->dns_results);
    wsi->dns_results = (addrinfo *)0x0;
  }
  return;
}

Assistant:

void
lws_addrinfo_clean(struct lws *wsi)
{
#if defined(LWS_WITH_CLIENT)
	if (!wsi->dns_results)
		return;

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	lws_async_dns_freeaddrinfo(&wsi->dns_results);
#else
	freeaddrinfo((struct addrinfo *)wsi->dns_results);
#endif
	wsi->dns_results = NULL;
#endif
}